

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall
clipp::parameter::parameter<char_const(&)[10]>(parameter *this,arg_string *str,char (*strs) [10])

{
  match_predicate local_60;
  predicate_adapter local_40;
  char (*local_20) [10];
  char (*strs_local) [10];
  arg_string *str_local;
  parameter *this_local;
  
  local_20 = strs;
  strs_local = (char (*) [10])str;
  str_local = (arg_string *)this;
  detail::token<clipp::parameter>::token(&this->super_token<clipp::parameter>);
  detail::action_provider<clipp::parameter>::action_provider
            (&this->super_action_provider<clipp::parameter>);
  (this->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->flags_);
  std::function<bool(std::__cxx11::string_const&)>::
  function<bool(&)(std::__cxx11::string_const&),void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_60,clipp::match::none);
  predicate_adapter::predicate_adapter(&local_40,&local_60);
  std::function<clipp::subrange(std::__cxx11::string_const&)>::
  function<clipp::parameter::predicate_adapter,void>
            ((function<clipp::subrange(std::__cxx11::string_const&)> *)&this->matcher_,&local_40);
  predicate_adapter::~predicate_adapter(&local_40);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_60);
  std::__cxx11::string::string((string *)&this->label_);
  this->required_ = false;
  this->greedy_ = false;
  add_flags<std::__cxx11::string,char_const(&)[10]>(this,(memento *)str,local_20);
  return;
}

Assistant:

explicit
    parameter(arg_string str, Strings&&... strs):
        flags_{},
        matcher_{predicate_adapter{match::none}},
        label_{}, required_{false}, greedy_{false}
    {
        add_flags(std::move(str), std::forward<Strings>(strs)...);
    }